

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineBspline.cpp
# Opt level: O3

void __thiscall
chrono::geometry::ChLineBspline::Derive(ChLineBspline *this,ChVector<double> *dir,double parU)

{
  ChVector<double> *pCVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  double *pdVar6;
  int i;
  undefined8 *puVar7;
  long cols;
  double *pdVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  ChMatrixDynamic<> NdN;
  DenseStorage<double,__1,__1,__1,_1> local_48;
  double local_28;
  
  if (this->closed == true) {
    parU = fmod(parU,1.0);
  }
  local_28 = ComputeKnotUfromU(this,parU);
  i = ChBasisToolsBspline::FindSpan(this->p,local_28,&this->knots);
  local_48.m_cols = 0;
  local_48.m_data = (double *)0x0;
  local_48.m_rows = 0;
  if ((long)this->p < -1) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>]"
                 );
  }
  cols = (long)this->p + 1;
  if (((int)cols != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(cols),0) < 2)) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar7 = std::ostream::_M_insert<bool>;
    __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_48,cols * 2,2,cols);
  ChBasisToolsBspline::BasisEvaluateDeriv
            (this->p,i,local_28,&this->knots,(ChMatrixDynamic<> *)&local_48);
  if (dir != (ChVector<double> *)&VNULL) {
    dir->m_data[0] = VNULL;
    dir->m_data[1] = DAT_00b689a0;
    dir->m_data[2] = DAT_00b689a8;
  }
  uVar5 = this->p;
  if ((int)uVar5 < 0) {
    if (local_48.m_data == (double *)0x0) {
      return;
    }
  }
  else {
    if (local_48.m_rows < 2) {
LAB_00800ded:
      __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
                   );
    }
    dVar2 = dir->m_data[2];
    dVar10 = dir->m_data[0];
    dVar11 = dir->m_data[1];
    pdVar8 = (this->points).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start[(int)(i - uVar5)].m_data + 2;
    uVar9 = 0;
    do {
      if ((~(local_48.m_cols >> 0x3f) & local_48.m_cols) == uVar9) goto LAB_00800ded;
      dVar3 = local_48.m_data[local_48.m_cols + uVar9];
      uVar9 = uVar9 + 1;
      dVar4 = *pdVar8;
      pCVar1 = (ChVector<double> *)(pdVar8 + -2);
      pdVar6 = pdVar8 + -1;
      pdVar8 = pdVar8 + 3;
      dVar10 = dVar3 * pCVar1->m_data[0] + dVar10;
      dVar11 = dVar3 * *pdVar6 + dVar11;
      dVar2 = dVar3 * dVar4 + dVar2;
      dir->m_data[0] = dVar10;
      dir->m_data[1] = dVar11;
      dir->m_data[2] = dVar2;
    } while ((ulong)uVar5 + 1 != uVar9);
  }
  free((void *)local_48.m_data[-1]);
  return;
}

Assistant:

void ChLineBspline::Derive(ChVector<>& dir, const double parU) const {
	double mU;
	if (this->closed)
		mU = fmod(parU, 1.0);
	else
		mU = parU;

    double u = ComputeKnotUfromU(mU);

    int spanU = ChBasisToolsBspline::FindSpan(this->p, u, this->knots);

    ChMatrixDynamic<> NdN(2, p + 1);  // basis on 1st row and their 1st derivatives on 2nd row
    ChBasisToolsBspline::BasisEvaluateDeriv(this->p, spanU, u, this->knots, NdN);

    dir = VNULL;
    int uind = spanU - p;
    for (int i = 0; i <= this->p; i++) {
        dir += points[uind + i] * NdN(1, i);
    }
}